

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cinject.h
# Opt level: O2

shared_ptr<Human> __thiscall
cinject::InstanceStorage<Human,_cinject::ConstructorFactory<Human,_void>_>::createInstance
          (InstanceStorage<Human,_cinject::ConstructorFactory<Human,_void>_> *this,
          InjectionContext *context)

{
  InjectionContext *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<Human> sVar1;
  ContextGuard guard;
  allocator local_99;
  string local_98;
  undefined1 local_78 [40];
  ContextGuard local_50;
  
  if (context[1].componentStack_.
      super__Vector_base<cinject::component_type,_std::allocator<cinject::component_type>_>._M_impl.
      super__Vector_impl_data._M_start == (pointer)0x0) {
    std::__cxx11::string::string((string *)&local_98,"Human being",&local_99);
  }
  else {
    std::__cxx11::string::string((string *)&local_98,(string *)(context + 1));
  }
  make_component_type<Human>((component_type *)local_78,&local_98);
  ContextGuard::ContextGuard(&local_50,in_RDX,(component_type *)local_78);
  std::__cxx11::string::~string((string *)(local_78 + 8));
  std::__cxx11::string::~string((string *)&local_98);
  ContextGuard::ensureNoCycle(&local_50);
  ConstructorFactory<Human,_void>::createInstance
            ((ConstructorFactory<Human,_void> *)this,(InjectionContext *)&context->componentStack_);
  ContextGuard::~ContextGuard(&local_50);
  sVar1.super___shared_ptr<Human,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = extraout_RDX._M_pi
  ;
  sVar1.super___shared_ptr<Human,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<Human>)sVar1.super___shared_ptr<Human,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<TImplementation> createInstance(InjectionContext* context)
    {
        ContextGuard guard(context, make_component_type<TImplementation>(!name_.empty() ? name_ : type_name<TImplementation>::value()));

        guard.ensureNoCycle();

        return factory_.createInstance(context);
    }